

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.pb.h
# Opt level: O0

Timestamp * __thiscall google::protobuf::Timestamp::operator=(Timestamp *this,Timestamp *from)

{
  bool bVar1;
  Arena *lhs;
  Arena *rhs;
  Timestamp *from_local;
  Timestamp *this_local;
  
  if (this != from) {
    lhs = MessageLite::GetArena((MessageLite *)this);
    rhs = MessageLite::GetArena((MessageLite *)from);
    bVar1 = internal::CanMoveWithInternalSwap(lhs,rhs);
    if (bVar1) {
      InternalSwap(this,from);
    }
    else {
      CopyFrom(this,from);
    }
  }
  return this;
}

Assistant:

inline Timestamp& operator=(Timestamp&& from) noexcept {
    if (this == &from) return *this;
    if (::google::protobuf::internal::CanMoveWithInternalSwap(GetArena(), from.GetArena())) {
      InternalSwap(&from);
    } else {
      CopyFrom(from);
    }
    return *this;
  }